

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_tests.cpp
# Opt level: O2

void __thiscall bloom_tests::merkle_block_4::test_method(merkle_block_4 *this)

{
  long lVar1;
  readonly_property<bool> rVar2;
  readonly_property65 rVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  iterator in_R8;
  iterator pvVar7;
  iterator in_R9;
  iterator pvVar8;
  long in_FS_OFFSET;
  Span<const_std::byte> sp;
  Span<const_unsigned_char> vKey;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  Span<const_unsigned_char> vKey_00;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  check_type cVar9;
  undefined1 *local_f40;
  undefined1 *local_f38;
  char *local_f30;
  char *local_f28;
  char *local_f20;
  char *local_f18;
  undefined1 *local_f10;
  undefined1 *local_f08;
  char *local_f00;
  char *local_ef8;
  char *local_ef0;
  char *local_ee8;
  undefined1 *local_ee0;
  undefined1 *local_ed8;
  char *local_ed0;
  char *local_ec8;
  char *local_ec0;
  char *local_eb8;
  undefined1 *local_eb0;
  undefined1 *local_ea8;
  char *local_ea0;
  char *local_e98;
  char *local_e90;
  char *local_e88;
  undefined1 *local_e80;
  undefined1 *local_e78;
  char *local_e70;
  char *local_e68;
  char *local_e60;
  char *local_e58;
  undefined1 *local_e50;
  undefined1 *local_e48;
  char *local_e40;
  char *local_e38;
  char *local_e30;
  char *local_e28;
  undefined1 *local_e20;
  undefined1 *local_e18;
  char *local_e10;
  char *local_e08;
  char *local_e00;
  char *local_df8;
  char *local_df0;
  char *local_de8;
  assertion_result local_de0;
  char **local_dc8;
  assertion_result local_dc0;
  undefined1 *local_da8;
  undefined1 *local_da0;
  char *local_d98;
  char *local_d90;
  char *local_d88;
  char *local_d80;
  undefined1 *local_d78;
  undefined1 *local_d70;
  char *local_d68;
  char *local_d60;
  char *local_d58;
  char *local_d50;
  undefined1 *local_d48;
  undefined1 *local_d40;
  char *local_d38;
  char *local_d30;
  char *local_d28;
  char *local_d20;
  undefined1 *local_d18;
  undefined1 *local_d10;
  char *local_d08;
  char *local_d00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vIndex;
  vector<uint256,_std::allocator<uint256>_> vMatched;
  char *local_cc0;
  char *local_cb8;
  undefined1 *local_cb0;
  undefined1 *local_ca8;
  char *local_ca0;
  char *local_c98;
  char *local_c90;
  char *local_c88;
  undefined1 *local_c80;
  undefined1 *local_c78;
  char *local_c70;
  char *local_c68;
  char *local_c60;
  char *local_c58;
  undefined1 *local_c50;
  undefined1 *local_c48;
  char *local_c40;
  char *local_c38;
  char *local_c30;
  char *local_c28;
  undefined1 *local_c20;
  undefined1 *local_c18;
  char *local_c10;
  char *local_c08;
  DataStream stream;
  CBloomFilter filter;
  undefined1 local_bb8 [16];
  undefined8 local_ba8;
  assertion_result *apaStack_ba0 [21];
  pair<unsigned_int,_uint256> pair;
  undefined1 local_ac8 [8];
  element_type *local_ac0;
  shared_count sStack_ab8;
  assertion_result *local_ab0;
  CMerkleBlock merkleBlock;
  CBlock block;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CBlock::CBlock(&block);
  memcpy(&merkleBlock,null_ARRAY_00b7ceb0,0x9f2);
  sp.m_size = 0x9f2;
  sp.m_data = (byte *)&merkleBlock;
  DataStream::DataStream(&stream,sp);
  merkleBlock.header._0_8_ = &::TX_WITH_WITNESS;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._4_8_ = &block;
  ParamsWrapper<TransactionSerParams,_CBlock>::Unserialize<DataStream>
            ((ParamsWrapper<TransactionSerParams,_CBlock> *)&merkleBlock,&stream);
  CBloomFilter::CBloomFilter(&filter,10,1e-06,0,'\x01');
  merkleBlock.header.nVersion = -0x20f53eac;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = '\x15';
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = 0x9b;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = 0xf1;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = '\x18';
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = 0xb8;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = 0xb2;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = 0xe6;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = ')';
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\x14';
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\x1a';
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = 0xc6;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = 0xb5;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = 0xc6;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = 0x9a;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = 0xdd;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = 0xf4;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = 0xdd;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = 0xea;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = '\x13';
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = '\n';
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x14] = '}';
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x15] = 'r';
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x16] = 0xa4;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x17] = 0xbd;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x18] = 0xf0;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x19] = 0x92;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1a] = '*';
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1b] = '\n';
  vKey.m_size = 0x20;
  vKey.m_data = (uchar *)&merkleBlock;
  CBloomFilter::insert(&filter,vKey);
  CMerkleBlock::CMerkleBlock(&merkleBlock,&block,&filter);
  local_c10 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_c08 = "";
  local_c20 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c18 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x178;
  file.m_begin = (iterator)&local_c10;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_c20,msg);
  CBlockHeader::GetHash((uint256 *)local_bb8,&merkleBlock.header);
  CBlockHeader::GetHash((uint256 *)&pair,&block.super_CBlockHeader);
  rVar2.super_class_property<bool>.value =
       (class_property<bool>)::operator==((base_blob<256U> *)local_bb8,(base_blob<256U> *)&pair);
  local_de0.m_message.px = (element_type *)0x0;
  local_de0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_3ca81c;
  vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xb7bab9;
  local_ac0 = (element_type *)((ulong)local_ac0 & 0xffffffffffffff00);
  local_ac8 = (undefined1  [8])&PTR__lazy_ostream_011481f0;
  sStack_ab8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_c30 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_c28 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_ab0 = (assertion_result *)&vMatched;
  local_de0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar2.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            (&local_de0,(lazy_ostream *)local_ac8,1,0,WARN,_cVar9,(size_t)&local_c30,0x178);
  boost::detail::shared_count::~shared_count(&local_de0.m_message.pn);
  local_c40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_c38 = "";
  local_c50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c48 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x17a;
  file_00.m_begin = (iterator)&local_c40;
  msg_00.m_end = pvVar8;
  msg_00.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_c50,
             msg_00);
  pair.first._0_1_ =
       (long)merkleBlock.vMatchedTxn.
             super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)merkleBlock.vMatchedTxn.
             super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
             ._M_impl.super__Vector_impl_data._M_start == 0x24;
  pair.second.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  pair.second.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  pair.second.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  pair.second.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  pair.second.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  pair.second.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  pair.second.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  pair.second.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  pair.second.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  pair.second.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  pair.second.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  pair.second.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  pair.second.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  pair.second.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  pair.second.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  pair.second.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  local_ac8 = (undefined1  [8])0xb7bba7;
  local_ac0 = (element_type *)0xb7bbca;
  local_bb8._8_8_ = local_bb8._8_8_ & 0xffffffffffffff00;
  local_bb8._0_8_ = &PTR__lazy_ostream_011481f0;
  local_ba8 = boost::unit_test::lazy_ostream::inst;
  local_c60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_c58 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  apaStack_ba0[0] = (assertion_result *)local_ac8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&pair,(lazy_ostream *)local_bb8,1,0,WARN,_cVar9,(size_t)&local_c60,
             0x17a);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(pair.second.super_base_blob<256U>.m_data._M_elems + 0xc));
  pair.first = (merkleBlock.vMatchedTxn.
                super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->first;
  pair.second.super_base_blob<256U>.m_data._M_elems[0] =
       ((merkleBlock.vMatchedTxn.
         super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data._M_elems
       [0];
  pair.second.super_base_blob<256U>.m_data._M_elems[1] =
       ((merkleBlock.vMatchedTxn.
         super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data._M_elems
       [1];
  pair.second.super_base_blob<256U>.m_data._M_elems[2] =
       ((merkleBlock.vMatchedTxn.
         super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data._M_elems
       [2];
  pair.second.super_base_blob<256U>.m_data._M_elems[3] =
       ((merkleBlock.vMatchedTxn.
         super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data._M_elems
       [3];
  pair.second.super_base_blob<256U>.m_data._M_elems._4_8_ =
       *(undefined8 *)
        (((merkleBlock.vMatchedTxn.
           super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data._M_elems
        + 4);
  pair.second.super_base_blob<256U>.m_data._M_elems._12_8_ =
       *(undefined8 *)
        (((merkleBlock.vMatchedTxn.
           super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data._M_elems
        + 0xc);
  pair.second.super_base_blob<256U>.m_data._M_elems._20_8_ =
       *(undefined8 *)
        (((merkleBlock.vMatchedTxn.
           super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data._M_elems
        + 0x14);
  pair.second.super_base_blob<256U>.m_data._M_elems._28_4_ =
       *(undefined4 *)
        (((merkleBlock.vMatchedTxn.
           super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data._M_elems
        + 0x1c);
  local_c70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_c68 = "";
  local_c80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c78 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x17d;
  file_01.m_begin = (iterator)&local_c70;
  msg_01.m_end = pvVar8;
  msg_01.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_c80,
             msg_01);
  local_bb8._0_8_ = (_func_int **)0x18f19b15df0ac154;
  local_bb8._8_8_ = 0xb5c61a1429e6b2b8;
  local_ba8._0_1_ = 0xc6;
  local_ba8._1_1_ = 0x9a;
  local_ba8._2_1_ = 0xdd;
  local_ba8._3_1_ = 0xf4;
  local_ba8._4_1_ = 0xdd;
  local_ba8._5_1_ = 0xea;
  local_ba8._6_1_ = '\x13';
  local_ba8._7_1_ = '\n';
  apaStack_ba0[0] = (assertion_result *)0xa2a92f0bda4727d;
  local_de0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ::operator==(&((merkleBlock.vMatchedTxn.
                       super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>,
                    (base_blob<256U> *)local_bb8);
  local_de0.m_message.px = (element_type *)0x0;
  local_de0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_3ca99d;
  vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xb7c07e;
  local_ac0 = (element_type *)((ulong)local_ac0 & 0xffffffffffffff00);
  local_ac8 = (undefined1  [8])&PTR__lazy_ostream_011481f0;
  sStack_ab8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_c90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_c88 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_ab0 = (assertion_result *)&vMatched;
  boost::test_tools::tt_detail::report_assertion
            (&local_de0,(lazy_ostream *)local_ac8,1,0,WARN,_cVar9,(size_t)&local_c90,0x17d);
  boost::detail::shared_count::~shared_count(&local_de0.m_message.pn);
  local_ca0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_c98 = "";
  local_cb0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ca8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x17e;
  file_02.m_begin = (iterator)&local_ca0;
  msg_02.m_end = pvVar8;
  msg_02.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_cb0,
             msg_02);
  local_ac8[0] = (class_property<bool>)
                 (class_property<bool>)
                 ((merkleBlock.vMatchedTxn.
                   super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->first == 6);
  local_ac0 = (element_type *)0x0;
  sStack_ab8.pi_ = (sp_counted_base *)0x0;
  local_de0._0_8_ = "merkleBlock.vMatchedTxn[0].first == 6";
  local_de0.m_message.px = (element_type *)0xb7c0a4;
  local_bb8._8_8_ = local_bb8._8_8_ & 0xffffffffffffff00;
  local_bb8._0_8_ = &PTR__lazy_ostream_011481f0;
  local_ba8 = boost::unit_test::lazy_ostream::inst;
  local_cc0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_cb8 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  apaStack_ba0[0] = &local_de0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_ac8,(lazy_ostream *)local_bb8,1,0,WARN,_cVar9,
             (size_t)&local_cc0,0x17e);
  boost::detail::shared_count::~shared_count(&sStack_ab8);
  vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d08 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_d00 = "";
  local_d18 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d10 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x182;
  file_03.m_begin = (iterator)&local_d08;
  msg_03.m_end = pvVar8;
  msg_03.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_d18,
             msg_03);
  CPartialMerkleTree::ExtractMatches((uint256 *)local_bb8,&merkleBlock.txn,&vMatched,&vIndex);
  rVar3.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ::operator==((base_blob<256U> *)local_bb8,
                    &block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>);
  local_de0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       rVar3.super_readonly_property<bool>.super_class_property<bool>.value;
  local_de0.m_message.px = (element_type *)0x0;
  local_de0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_ab0 = &local_dc0;
  local_dc0._0_8_ = "merkleBlock.txn.ExtractMatches(vMatched, vIndex) == block.hashMerkleRoot";
  local_dc0.m_message.px = (element_type *)0xb7ba26;
  local_ac0 = (element_type *)((ulong)local_ac0 & 0xffffffffffffff00);
  local_ac8 = (undefined1  [8])&PTR__lazy_ostream_011481f0;
  sStack_ab8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d28 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_d20 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_de0,(lazy_ostream *)local_ac8,1,0,WARN,_cVar9,(size_t)&local_d28,0x182);
  boost::detail::shared_count::~shared_count(&local_de0.m_message.pn);
  local_d38 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_d30 = "";
  local_d48 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d40 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x183;
  file_04.m_begin = (iterator)&local_d38;
  msg_04.m_end = pvVar8;
  msg_04.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_d48,
             msg_04);
  local_ac8[0] = (class_property<bool>)
                 (class_property<bool>)
                 ((long)vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_start >> 5 ==
                 ((long)merkleBlock.vMatchedTxn.
                        super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)merkleBlock.vMatchedTxn.
                       super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x24);
  local_ac0 = (element_type *)0x0;
  sStack_ab8.pi_ = (sp_counted_base *)0x0;
  local_de0._0_8_ = "vMatched.size() == merkleBlock.vMatchedTxn.size()";
  local_de0.m_message.px = (element_type *)0xb7ba58;
  local_bb8._8_8_ = local_bb8._8_8_ & 0xffffffffffffff00;
  local_bb8._0_8_ = &PTR__lazy_ostream_011481f0;
  local_ba8 = boost::unit_test::lazy_ostream::inst;
  apaStack_ba0[0] = &local_de0;
  local_d58 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_d50 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_ac8,(lazy_ostream *)local_bb8,1,0,WARN,_cVar9,
             (size_t)&local_d58,0x183);
  boost::detail::shared_count::~shared_count(&sStack_ab8);
  for (uVar5 = 0; uVar6 = (ulong)uVar5,
      uVar6 < (ulong)((long)vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_start >> 5); uVar5 = uVar5 + 1) {
    local_d68 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
    local_d60 = "";
    local_d78 = &boost::unit_test::basic_cstring<char_const>::null;
    local_d70 = &boost::unit_test::basic_cstring<char_const>::null;
    file_05.m_end = (iterator)0x185;
    file_05.m_begin = (iterator)&local_d68;
    msg_05.m_end = pvVar8;
    msg_05.m_begin = pvVar7;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_d78,
               msg_05);
    bVar4 = ::operator==(&vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar6].super_base_blob<256U>,
                         &merkleBlock.vMatchedTxn.
                          super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar6].second.
                          super_base_blob<256U>);
    local_ac8[0] = (class_property<bool>)(class_property<bool>)bVar4;
    local_ac0 = (element_type *)0x0;
    sStack_ab8.pi_ = (sp_counted_base *)0x0;
    local_de0._0_8_ = "vMatched[i] == merkleBlock.vMatchedTxn[i].second";
    local_de0.m_message.px = (element_type *)0xb7ba89;
    local_bb8._8_8_ = local_bb8._8_8_ & 0xffffffffffffff00;
    local_bb8._0_8_ = &PTR__lazy_ostream_011481f0;
    local_ba8 = boost::unit_test::lazy_ostream::inst;
    apaStack_ba0[0] = &local_de0;
    local_d88 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
    local_d80 = "";
    pvVar7 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_ac8,(lazy_ostream *)local_bb8,1,0,WARN,_cVar9,
               (size_t)&local_d88,0x185);
    boost::detail::shared_count::~shared_count(&sStack_ab8);
  }
  local_bb8._0_8_ = (_func_int **)0x67326471df5bc041;
  local_bb8._8_8_ = 0x5a10f27a03cfd2de;
  local_ba8._0_1_ = '\x03';
  local_ba8._1_1_ = 'f';
  local_ba8._2_1_ = '!';
  local_ba8._3_1_ = 0xfc;
  local_ba8._4_1_ = 0xf4;
  local_ba8._5_1_ = 'h';
  local_ba8._6_1_ = 'X';
  local_ba8._7_1_ = 0xbc;
  apaStack_ba0[0] = (assertion_result *)0x2981fa052f0481d;
  vKey_00.m_size = 0x20;
  vKey_00.m_data = local_bb8;
  CBloomFilter::insert(&filter,vKey_00);
  CMerkleBlock::CMerkleBlock((CMerkleBlock *)local_bb8,&block,&filter);
  CMerkleBlock::operator=(&merkleBlock,(CMerkleBlock *)local_bb8);
  CMerkleBlock::~CMerkleBlock((CMerkleBlock *)local_bb8);
  local_d98 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_d90 = "";
  local_da8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_da0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x18a;
  file_06.m_begin = (iterator)&local_d98;
  msg_06.m_end = pvVar8;
  msg_06.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_da8,
             msg_06);
  CBlockHeader::GetHash((uint256 *)local_bb8,&merkleBlock.header);
  CBlockHeader::GetHash((uint256 *)local_ac8,&block.super_CBlockHeader);
  bVar4 = ::operator==((base_blob<256U> *)local_bb8,(base_blob<256U> *)local_ac8);
  local_dc0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar4;
  local_dc0.m_message.px = (element_type *)0x0;
  local_dc0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_dc8 = &local_df0;
  local_df0 = "merkleBlock.header.GetHash() == block.GetHash()";
  local_de8 = "";
  local_de0.m_message.px = (element_type *)((ulong)local_de0.m_message.px & 0xffffffffffffff00);
  local_de0._0_8_ = &PTR__lazy_ostream_011481f0;
  local_de0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_e00 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_df8 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_dc0,(lazy_ostream *)&local_de0,1,0,WARN,_cVar9,(size_t)&local_e00,0x18a);
  boost::detail::shared_count::~shared_count(&local_dc0.m_message.pn);
  local_e10 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_e08 = "";
  local_e20 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e18 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x18c;
  file_07.m_begin = (iterator)&local_e10;
  msg_07.m_end = pvVar8;
  msg_07.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_e20,
             msg_07);
  local_ac8[0] = (class_property<bool>)
                 (class_property<bool>)
                 ((long)merkleBlock.vMatchedTxn.
                        super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)merkleBlock.vMatchedTxn.
                        super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                        ._M_impl.super__Vector_impl_data._M_start == 0x48);
  local_ac0 = (element_type *)0x0;
  sStack_ab8.pi_ = (sp_counted_base *)0x0;
  local_de0._0_8_ = "merkleBlock.vMatchedTxn.size() == 2";
  local_de0.m_message.px = (element_type *)0xb7badd;
  local_bb8._8_8_ = local_bb8._8_8_ & 0xffffffffffffff00;
  local_bb8._0_8_ = &PTR__lazy_ostream_011481f0;
  local_ba8 = boost::unit_test::lazy_ostream::inst;
  local_e30 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_e28 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  apaStack_ba0[0] = &local_de0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_ac8,(lazy_ostream *)local_bb8,1,0,WARN,_cVar9,
             (size_t)&local_e30,0x18c);
  boost::detail::shared_count::~shared_count(&sStack_ab8);
  local_e40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_e38 = "";
  local_e50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e48 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x18e;
  file_08.m_begin = (iterator)&local_e40;
  msg_08.m_end = pvVar8;
  msg_08.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_e50,
             msg_08);
  local_bb8._0_8_ = (_func_int **)0x67326471df5bc041;
  local_bb8._8_8_ = 0x5a10f27a03cfd2de;
  local_ba8._0_1_ = '\x03';
  local_ba8._1_1_ = 'f';
  local_ba8._2_1_ = '!';
  local_ba8._3_1_ = 0xfc;
  local_ba8._4_1_ = 0xf4;
  local_ba8._5_1_ = 'h';
  local_ba8._6_1_ = 'X';
  local_ba8._7_1_ = 0xbc;
  apaStack_ba0[0] = (assertion_result *)0x2981fa052f0481d;
  rVar3.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ::operator==(&((merkleBlock.vMatchedTxn.
                       super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>,
                    (base_blob<256U> *)local_bb8);
  local_de0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       rVar3.super_readonly_property<bool>.super_class_property<bool>.value;
  local_de0.m_message.px = (element_type *)0x0;
  local_de0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_dc0._0_8_ =
       "merkleBlock.vMatchedTxn[0].second == uint256{\"02981fa052f0481dbc5868f4fc2166035a10f27a03cfd2de67326471df5bc041\"}"
  ;
  local_dc0.m_message.px = (element_type *)0xb7c115;
  local_ac0 = (element_type *)((ulong)local_ac0 & 0xffffffffffffff00);
  local_ac8 = (undefined1  [8])&PTR__lazy_ostream_011481f0;
  sStack_ab8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_e60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_e58 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_ab0 = &local_dc0;
  boost::test_tools::tt_detail::report_assertion
            (&local_de0,(lazy_ostream *)local_ac8,1,0,WARN,_cVar9,(size_t)&local_e60,0x18e);
  boost::detail::shared_count::~shared_count(&local_de0.m_message.pn);
  local_e70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_e68 = "";
  local_e80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e78 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x18f;
  file_09.m_begin = (iterator)&local_e70;
  msg_09.m_end = pvVar8;
  msg_09.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_e80,
             msg_09);
  local_ac0 = (element_type *)0x0;
  sStack_ab8.pi_ = (sp_counted_base *)0x0;
  local_de0._0_8_ = "merkleBlock.vMatchedTxn[0].first == 3";
  local_de0.m_message.px = (element_type *)0xb7c13b;
  local_bb8._8_8_ = local_bb8._8_8_ & 0xffffffffffffff00;
  local_bb8._0_8_ = &PTR__lazy_ostream_011481f0;
  local_ba8 = boost::unit_test::lazy_ostream::inst;
  local_e90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_e88 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  apaStack_ba0[0] = &local_de0;
  local_ac8[0] = (class_property<bool>)
                 (class_property<bool>)
                 ((merkleBlock.vMatchedTxn.
                   super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->first == 3);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_ac8,(lazy_ostream *)local_bb8,1,0,WARN,_cVar9,
             (size_t)&local_e90,399);
  boost::detail::shared_count::~shared_count(&sStack_ab8);
  local_ea0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_e98 = "";
  local_eb0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ea8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x191;
  file_10.m_begin = (iterator)&local_ea0;
  msg_10.m_end = pvVar8;
  msg_10.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_eb0,
             msg_10);
  local_ac8[0] = (class_property<bool>)
                 std::operator==(merkleBlock.vMatchedTxn.
                                 super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 1,&pair);
  local_ac0 = (element_type *)0x0;
  sStack_ab8.pi_ = (sp_counted_base *)0x0;
  local_de0._0_8_ = "merkleBlock.vMatchedTxn[1] == pair";
  local_de0.m_message.px = (element_type *)0xb7bb00;
  local_bb8._8_8_ = local_bb8._8_8_ & 0xffffffffffffff00;
  local_bb8._0_8_ = &PTR__lazy_ostream_011481f0;
  local_ba8 = boost::unit_test::lazy_ostream::inst;
  local_ec0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_eb8 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  apaStack_ba0[0] = &local_de0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_ac8,(lazy_ostream *)local_bb8,1,0,WARN,_cVar9,
             (size_t)&local_ec0,0x191);
  boost::detail::shared_count::~shared_count(&sStack_ab8);
  local_ed0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_ec8 = "";
  local_ee0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ed8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x193;
  file_11.m_begin = (iterator)&local_ed0;
  msg_11.m_end = pvVar8;
  msg_11.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_ee0,
             msg_11);
  CPartialMerkleTree::ExtractMatches((uint256 *)local_bb8,&merkleBlock.txn,&vMatched,&vIndex);
  rVar3.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ::operator==((base_blob<256U> *)local_bb8,
                    &block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>);
  local_de0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       rVar3.super_readonly_property<bool>.super_class_property<bool>.value;
  local_de0.m_message.px = (element_type *)0x0;
  local_de0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_dc0._0_8_ = "merkleBlock.txn.ExtractMatches(vMatched, vIndex) == block.hashMerkleRoot";
  local_dc0.m_message.px = (element_type *)0xb7ba26;
  local_ac0 = (element_type *)((ulong)local_ac0 & 0xffffffffffffff00);
  local_ac8 = (undefined1  [8])&PTR__lazy_ostream_011481f0;
  sStack_ab8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_ef0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_ee8 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_ab0 = &local_dc0;
  boost::test_tools::tt_detail::report_assertion
            (&local_de0,(lazy_ostream *)local_ac8,1,0,WARN,_cVar9,(size_t)&local_ef0,0x193);
  boost::detail::shared_count::~shared_count(&local_de0.m_message.pn);
  local_f00 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_ef8 = "";
  local_f10 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f08 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x194;
  file_12.m_begin = (iterator)&local_f00;
  msg_12.m_end = pvVar8;
  msg_12.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_f10,
             msg_12);
  local_ac8[0] = (class_property<bool>)
                 (class_property<bool>)
                 ((long)vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_start >> 5 ==
                 ((long)merkleBlock.vMatchedTxn.
                        super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)merkleBlock.vMatchedTxn.
                       super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x24);
  local_ac0 = (element_type *)0x0;
  sStack_ab8.pi_ = (sp_counted_base *)0x0;
  local_de0._0_8_ = "vMatched.size() == merkleBlock.vMatchedTxn.size()";
  local_de0.m_message.px = (element_type *)0xb7ba58;
  local_bb8._8_8_ = local_bb8._8_8_ & 0xffffffffffffff00;
  local_bb8._0_8_ = &PTR__lazy_ostream_011481f0;
  local_ba8 = boost::unit_test::lazy_ostream::inst;
  apaStack_ba0[0] = &local_de0;
  local_f20 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_f18 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_ac8,(lazy_ostream *)local_bb8,1,0,WARN,_cVar9,
             (size_t)&local_f20,0x194);
  boost::detail::shared_count::~shared_count(&sStack_ab8);
  for (uVar5 = 0; uVar6 = (ulong)uVar5,
      uVar6 < (ulong)((long)vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_start >> 5); uVar5 = uVar5 + 1) {
    local_f30 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
    local_f28 = "";
    local_f40 = &boost::unit_test::basic_cstring<char_const>::null;
    local_f38 = &boost::unit_test::basic_cstring<char_const>::null;
    file_13.m_end = (iterator)0x196;
    file_13.m_begin = (iterator)&local_f30;
    msg_13.m_end = pvVar8;
    msg_13.m_begin = pvVar7;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_f40,
               msg_13);
    bVar4 = ::operator==(&vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar6].super_base_blob<256U>,
                         &merkleBlock.vMatchedTxn.
                          super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar6].second.
                          super_base_blob<256U>);
    local_ac8[0] = (class_property<bool>)(class_property<bool>)bVar4;
    local_ac0 = (element_type *)0x0;
    sStack_ab8.pi_ = (sp_counted_base *)0x0;
    local_de0._0_8_ = "vMatched[i] == merkleBlock.vMatchedTxn[i].second";
    local_de0.m_message.px = (element_type *)0xb7ba89;
    local_bb8._8_8_ = local_bb8._8_8_ & 0xffffffffffffff00;
    local_bb8._0_8_ = &PTR__lazy_ostream_011481f0;
    local_ba8 = boost::unit_test::lazy_ostream::inst;
    apaStack_ba0[0] = &local_de0;
    pvVar7 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_ac8,(lazy_ostream *)local_bb8,1,0,WARN,0xb7b44c,
               (size_t)&stack0xfffffffffffff0b0,0x196);
    boost::detail::shared_count::~shared_count(&sStack_ab8);
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base
            (&vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>);
  CMerkleBlock::~CMerkleBlock(&merkleBlock);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&filter);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&stream);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&block.vtx);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(merkle_block_4)
{
    // Random real block (000000000000b731f2eef9e8c63173adfb07e41bd53eb0ef0a6b720d6cb6dea4)
    // With 7 txes
    CBlock block;
    DataStream stream{
        "0100000082bb869cf3a793432a66e826e05a6fc37469f8efb7421dc880670100000000007f16c5962e8bd963659c793ce370d95f093bc7e367117b3c30c1f8fdd0d9728776381b4d4c86041b554b85290701000000010000000000000000000000000000000000000000000000000000000000000000ffffffff07044c86041b0136ffffffff0100f2052a01000000434104eaafc2314def4ca98ac970241bcab022b9c1e1f4ea423a20f134c876f2c01ec0f0dd5b2e86e7168cefe0d81113c3807420ce13ad1357231a2252247d97a46a91ac000000000100000001bcad20a6a29827d1424f08989255120bf7f3e9e3cdaaa6bb31b0737fe048724300000000494830450220356e834b046cadc0f8ebb5a8a017b02de59c86305403dad52cd77b55af062ea10221009253cd6c119d4729b77c978e1e2aa19f5ea6e0e52b3f16e32fa608cd5bab753901ffffffff02008d380c010000001976a9142b4b8072ecbba129b6453c63e129e643207249ca88ac0065cd1d000000001976a9141b8dd13b994bcfc787b32aeadf58ccb3615cbd5488ac000000000100000003fdacf9b3eb077412e7a968d2e4f11b9a9dee312d666187ed77ee7d26af16cb0b000000008c493046022100ea1608e70911ca0de5af51ba57ad23b9a51db8d28f82c53563c56a05c20f5a87022100a8bdc8b4a8acc8634c6b420410150775eb7f2474f5615f7fccd65af30f310fbf01410465fdf49e29b06b9a1582287b6279014f834edc317695d125ef623c1cc3aaece245bd69fcad7508666e9c74a49dc9056d5fc14338ef38118dc4afae5fe2c585caffffffff309e1913634ecb50f3c4f83e96e70b2df071b497b8973a3e75429df397b5af83000000004948304502202bdb79c596a9ffc24e96f4386199aba386e9bc7b6071516e2b51dda942b3a1ed022100c53a857e76b724fc14d45311eac5019650d415c3abb5428f3aae16d8e69bec2301ffffffff2089e33491695080c9edc18a428f7d834db5b6d372df13ce2b1b0e0cbcb1e6c10000000049483045022100d4ce67c5896ee251c810ac1ff9ceccd328b497c8f553ab6e08431e7d40bad6b5022033119c0c2b7d792d31f1187779c7bd95aefd93d90a715586d73801d9b47471c601ffffffff0100714460030000001976a914c7b55141d097ea5df7a0ed330cf794376e53ec8d88ac0000000001000000045bf0e214aa4069a3e792ecee1e1bf0c1d397cde8dd08138f4b72a00681743447000000008b48304502200c45de8c4f3e2c1821f2fc878cba97b1e6f8807d94930713aa1c86a67b9bf1e40221008581abfef2e30f957815fc89978423746b2086375ca8ecf359c85c2a5b7c88ad01410462bb73f76ca0994fcb8b4271e6fb7561f5c0f9ca0cf6485261c4a0dc894f4ab844c6cdfb97cd0b60ffb5018ffd6238f4d87270efb1d3ae37079b794a92d7ec95ffffffffd669f7d7958d40fc59d2253d88e0f248e29b599c80bbcec344a83dda5f9aa72c000000008a473044022078124c8beeaa825f9e0b30bff96e564dd859432f2d0cb3b72d3d5d93d38d7e930220691d233b6c0f995be5acb03d70a7f7a65b6bc9bdd426260f38a1346669507a3601410462bb73f76ca0994fcb8b4271e6fb7561f5c0f9ca0cf6485261c4a0dc894f4ab844c6cdfb97cd0b60ffb5018ffd6238f4d87270efb1d3ae37079b794a92d7ec95fffffffff878af0d93f5229a68166cf051fd372bb7a537232946e0a46f53636b4dafdaa4000000008c493046022100c717d1714551663f69c3c5759bdbb3a0fcd3fab023abc0e522fe6440de35d8290221008d9cbe25bffc44af2b18e81c58eb37293fd7fe1c2e7b46fc37ee8c96c50ab1e201410462bb73f76ca0994fcb8b4271e6fb7561f5c0f9ca0cf6485261c4a0dc894f4ab844c6cdfb97cd0b60ffb5018ffd6238f4d87270efb1d3ae37079b794a92d7ec95ffffffff27f2b668859cd7f2f894aa0fd2d9e60963bcd07c88973f425f999b8cbfd7a1e2000000008c493046022100e00847147cbf517bcc2f502f3ddc6d284358d102ed20d47a8aa788a62f0db780022100d17b2d6fa84dcaf1c95d88d7e7c30385aecf415588d749afd3ec81f6022cecd701410462bb73f76ca0994fcb8b4271e6fb7561f5c0f9ca0cf6485261c4a0dc894f4ab844c6cdfb97cd0b60ffb5018ffd6238f4d87270efb1d3ae37079b794a92d7ec95ffffffff0100c817a8040000001976a914b6efd80d99179f4f4ff6f4dd0a007d018c385d2188ac000000000100000001834537b2f1ce8ef9373a258e10545ce5a50b758df616cd4356e0032554ebd3c4000000008b483045022100e68f422dd7c34fdce11eeb4509ddae38201773dd62f284e8aa9d96f85099d0b002202243bd399ff96b649a0fad05fa759d6a882f0af8c90cf7632c2840c29070aec20141045e58067e815c2f464c6a2a15f987758374203895710c2d452442e28496ff38ba8f5fd901dc20e29e88477167fe4fc299bf818fd0d9e1632d467b2a3d9503b1aaffffffff0280d7e636030000001976a914f34c3e10eb387efe872acb614c89e78bfca7815d88ac404b4c00000000001976a914a84e272933aaf87e1715d7786c51dfaeb5b65a6f88ac00000000010000000143ac81c8e6f6ef307dfe17f3d906d999e23e0189fda838c5510d850927e03ae7000000008c4930460221009c87c344760a64cb8ae6685a3eec2c1ac1bed5b88c87de51acd0e124f266c16602210082d07c037359c3a257b5c63ebd90f5a5edf97b2ac1c434b08ca998839f346dd40141040ba7e521fa7946d12edbb1d1e95a15c34bd4398195e86433c92b431cd315f455fe30032ede69cad9d1e1ed6c3c4ec0dbfced53438c625462afb792dcb098544bffffffff0240420f00000000001976a9144676d1b820d63ec272f1900d59d43bc6463d96f888ac40420f00000000001976a914648d04341d00d7968b3405c034adc38d4d8fb9bd88ac00000000010000000248cc917501ea5c55f4a8d2009c0567c40cfe037c2e71af017d0a452ff705e3f1000000008b483045022100bf5fdc86dc5f08a5d5c8e43a8c9d5b1ed8c65562e280007b52b133021acd9acc02205e325d613e555f772802bf413d36ba807892ed1a690a77811d3033b3de226e0a01410429fa713b124484cb2bd7b5557b2c0b9df7b2b1fee61825eadc5ae6c37a9920d38bfccdc7dc3cb0c47d7b173dbc9db8d37db0a33ae487982c59c6f8606e9d1791ffffffff41ed70551dd7e841883ab8f0b16bf04176b7d1480e4f0af9f3d4c3595768d068000000008b4830450221008513ad65187b903aed1102d1d0c47688127658c51106753fed0151ce9c16b80902201432b9ebcb87bd04ceb2de66035fbbaf4bf8b00d1cfe41f1a1f7338f9ad79d210141049d4cf80125bf50be1709f718c07ad15d0fc612b7da1f5570dddc35f2a352f0f27c978b06820edca9ef982c35fda2d255afba340068c5035552368bc7200c1488ffffffff0100093d00000000001976a9148edb68822f1ad580b043c7b3df2e400f8699eb4888ac00000000"_hex,
    };
    stream >> TX_WITH_WITNESS(block);

    CBloomFilter filter(10, 0.000001, 0, BLOOM_UPDATE_ALL);
    // Match the last transaction
    filter.insert(uint256{"0a2a92f0bda4727d0a13eaddf4dd9ac6b5c61a1429e6b2b818f19b15df0ac154"});

    CMerkleBlock merkleBlock(block, filter);
    BOOST_CHECK(merkleBlock.header.GetHash() == block.GetHash());

    BOOST_CHECK(merkleBlock.vMatchedTxn.size() == 1);
    std::pair<unsigned int, uint256> pair = merkleBlock.vMatchedTxn[0];

    BOOST_CHECK(merkleBlock.vMatchedTxn[0].second == uint256{"0a2a92f0bda4727d0a13eaddf4dd9ac6b5c61a1429e6b2b818f19b15df0ac154"});
    BOOST_CHECK(merkleBlock.vMatchedTxn[0].first == 6);

    std::vector<uint256> vMatched;
    std::vector<unsigned int> vIndex;
    BOOST_CHECK(merkleBlock.txn.ExtractMatches(vMatched, vIndex) == block.hashMerkleRoot);
    BOOST_CHECK(vMatched.size() == merkleBlock.vMatchedTxn.size());
    for (unsigned int i = 0; i < vMatched.size(); i++)
        BOOST_CHECK(vMatched[i] == merkleBlock.vMatchedTxn[i].second);

    // Also match the 4th transaction
    filter.insert(uint256{"02981fa052f0481dbc5868f4fc2166035a10f27a03cfd2de67326471df5bc041"});
    merkleBlock = CMerkleBlock(block, filter);
    BOOST_CHECK(merkleBlock.header.GetHash() == block.GetHash());

    BOOST_CHECK(merkleBlock.vMatchedTxn.size() == 2);

    BOOST_CHECK(merkleBlock.vMatchedTxn[0].second == uint256{"02981fa052f0481dbc5868f4fc2166035a10f27a03cfd2de67326471df5bc041"});
    BOOST_CHECK(merkleBlock.vMatchedTxn[0].first == 3);

    BOOST_CHECK(merkleBlock.vMatchedTxn[1] == pair);

    BOOST_CHECK(merkleBlock.txn.ExtractMatches(vMatched, vIndex) == block.hashMerkleRoot);
    BOOST_CHECK(vMatched.size() == merkleBlock.vMatchedTxn.size());
    for (unsigned int i = 0; i < vMatched.size(); i++)
        BOOST_CHECK(vMatched[i] == merkleBlock.vMatchedTxn[i].second);
}